

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  anon_struct_8_0_00000001_for___align aVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 time;
  int i;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar24 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar27 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 in_XMM18 [16];
  Vector3f VVar37;
  string ret;
  SampledWavelengths lambda;
  Tuple3<pbrt::Vector3,_float> local_120;
  undefined1 local_110 [112];
  bool local_a0;
  Vector3f *local_98;
  Vector3f *local_90;
  Vector3f *local_88;
  Vector3f *local_80;
  undefined1 local_78 [16];
  CameraSample local_68;
  SampledWavelengths local_50;
  
  auVar15._8_4_ = 0x7f800000;
  auVar15._0_8_ = 0x7f8000007f800000;
  auVar15._12_4_ = 0x7f800000;
  local_90 = &this->minDirDifferentialY;
  local_98 = &this->minDirDifferentialX;
  local_80 = &this->minPosDifferentialY;
  local_88 = &this->minPosDifferentialX;
  uVar2 = vmovlps_avx(auVar15);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  uVar3 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar4 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  local_68.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
  local_68.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.5;
  local_68.time = 0.5;
  local_68.weight = 1.0;
  SampledWavelengths::SampleXYZ(&local_50,0.5);
  iVar6 = 0;
  do {
    auVar15 = vcvtsi2ss_avx512f(in_XMM18,iVar6);
    local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.y = auVar15._0_4_ / 511.0;
    uVar2 = *(undefined8 *)
             ((this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
             0xffffffffffff);
    auVar15 = vcvtsi2ss_avx512f(in_XMM18,(int)uVar2);
    auVar16 = vcvtsi2ss_avx512f(in_XMM18,(int)((ulong)uVar2 >> 0x20));
    local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
         local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.y * auVar15._0_4_;
    local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
         local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.y * auVar16._0_4_;
    CameraHandle::GenerateRayDifferential
              ((optional<pbrt::CameraRayDifferential> *)local_110,camera,&local_68,&local_50);
    time = local_110._24_4_;
    uVar5 = local_110._8_4_;
    if (local_a0 == true) {
      local_78._8_8_ = 0;
      local_78._0_8_ = local_110._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_110._44_8_;
      auVar15 = vsubps_avx(auVar16,local_78);
      local_120._0_8_ = vmovlps_avx(auVar15);
      auVar21 = (undefined1  [56])0x0;
      local_120.z = (float)local_110._52_4_ - (float)local_110._8_4_;
      auVar27 = (undefined1  [60])0x0;
      VVar37 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,(Vector3f *)&local_120,(Float)local_110._24_4_);
      auVar25._0_4_ = VVar37.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar25._4_60_ = auVar27;
      auVar19._0_8_ = VVar37.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar21;
      fVar23 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar17 = auVar19._0_16_;
      auVar13._0_4_ =
           VVar37.super_Tuple3<pbrt::Vector3,_float>.x * VVar37.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar13._4_4_ =
           VVar37.super_Tuple3<pbrt::Vector3,_float>.y * VVar37.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar13._8_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar13._12_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar15 = vmovshdup_avx(auVar13);
      auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
      auVar15 = vfmadd231ss_fma(auVar15,auVar25._0_16_,auVar25._0_16_);
      auVar16 = ZEXT416((uint)(this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar16,auVar16);
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      auVar13 = ZEXT416((uint)(this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar16 = vfmadd213ss_fma(auVar13,auVar13,auVar16);
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      if (auVar15._0_4_ < auVar16._0_4_) {
        uVar2 = vmovlps_avx(auVar17);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = auVar25._0_4_;
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_110._56_8_;
      auVar15 = vsubps_avx(auVar17,local_78);
      local_120.z = (float)local_110._64_4_ - (float)uVar5;
      auVar27 = (undefined1  [60])0x0;
      local_120._0_8_ = vmovlps_avx(auVar15);
      auVar21 = (undefined1  [56])0x0;
      VVar37 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,(Vector3f *)&local_120,(Float)time);
      auVar26._0_4_ = VVar37.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._4_60_ = auVar27;
      auVar20._0_8_ = VVar37.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar21;
      fVar23 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar17 = auVar20._0_16_;
      auVar29._0_4_ =
           VVar37.super_Tuple3<pbrt::Vector3,_float>.x * VVar37.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar29._4_4_ =
           VVar37.super_Tuple3<pbrt::Vector3,_float>.y * VVar37.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar29._8_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar29._12_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar15 = vmovshdup_avx(auVar29);
      auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
      auVar15 = vfmadd231ss_fma(auVar15,auVar26._0_16_,auVar26._0_16_);
      auVar16 = ZEXT416((uint)(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar16,auVar16);
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      auVar13 = ZEXT416((uint)(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar16 = vfmadd213ss_fma(auVar13,auVar13,auVar16);
      auVar16 = vsqrtss_avx(auVar16,auVar16);
      if (auVar15._0_4_ < auVar16._0_4_) {
        uVar2 = vmovlps_avx(auVar17);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = auVar26._0_4_;
      }
      auVar24._4_4_ = local_110._16_4_;
      auVar24._0_4_ = local_110._12_4_;
      auVar24._8_8_ = 0;
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar14._0_4_ = (float)local_110._12_4_ * (float)local_110._12_4_;
      auVar14._4_4_ = (float)local_110._16_4_ * (float)local_110._16_4_;
      auVar14._8_8_ = 0;
      auVar17 = vmovshdup_avx(auVar14);
      auVar17 = vfmadd231ss_fma(auVar17,auVar24,auVar24);
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_110._20_4_),
                                ZEXT416((uint)local_110._20_4_));
      auVar17 = vsqrtss_avx(auVar17,auVar17);
      fVar23 = auVar17._0_4_;
      auVar30._4_4_ = fVar23;
      auVar30._0_4_ = fVar23;
      auVar30._8_4_ = fVar23;
      auVar30._12_4_ = fVar23;
      auVar18._0_4_ = (float)local_110._20_4_ / fVar23;
      auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar17 = vdivps_avx(auVar24,auVar30);
      auVar7 = vpternlogd_avx512vl(auVar33,auVar18,auVar7,0xf8);
      uVar2 = vmovlps_avx(auVar17);
      local_110._12_4_ = (undefined4)uVar2;
      local_110._16_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      auVar24 = vmovshdup_avx(auVar17);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_110._68_8_;
      auVar9._0_4_ = (float)local_110._68_8_ * (float)local_110._68_8_;
      auVar9._4_4_ = SUB84(local_110._68_8_,4) * SUB84(local_110._68_8_,4);
      auVar9._8_8_ = 0;
      auVar13 = vmovshdup_avx(auVar9);
      auVar13 = vfmadd231ss_fma(auVar13,auVar31,auVar31);
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_110._76_4_),
                                ZEXT416((uint)local_110._76_4_));
      auVar13 = vsqrtss_avx(auVar13,auVar13);
      fVar23 = auVar13._0_4_;
      auVar11._4_4_ = fVar23;
      auVar11._0_4_ = fVar23;
      auVar11._8_4_ = fVar23;
      auVar11._12_4_ = fVar23;
      local_110._76_4_ = (float)local_110._76_4_ / fVar23;
      auVar32 = ZEXT416((uint)local_110._76_4_);
      auVar13 = vdivps_avx(auVar31,auVar11);
      local_110._68_8_ = vmovlps_avx(auVar13);
      auVar14 = vmovshdup_avx(auVar13);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_110._80_8_;
      auVar10._0_4_ = (float)local_110._80_8_ * (float)local_110._80_8_;
      auVar10._4_4_ = SUB84(local_110._80_8_,4) * SUB84(local_110._80_8_,4);
      auVar10._8_8_ = 0;
      auVar29 = vmovshdup_avx(auVar10);
      auVar29 = vfmadd231ss_fma(auVar29,auVar8,auVar8);
      auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)local_110._88_4_),
                                ZEXT416((uint)local_110._88_4_));
      auVar29 = vsqrtss_avx(auVar29,auVar29);
      fVar23 = auVar29._0_4_;
      auVar12._4_4_ = fVar23;
      auVar12._0_4_ = fVar23;
      auVar12._8_4_ = fVar23;
      auVar12._12_4_ = fVar23;
      auVar28._0_4_ = (float)local_110._88_4_ / fVar23;
      auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
      fVar36 = auVar7._0_4_;
      auVar29 = vdivps_avx(auVar8,auVar12);
      fVar34 = -1.0 / (fVar36 + auVar18._0_4_);
      fVar22 = auVar17._0_4_;
      fVar35 = auVar24._0_4_;
      local_110._80_8_ = vmovlps_avx(auVar29);
      fVar23 = fVar35 * fVar22 * fVar34;
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)(fVar22 * fVar36 * fVar22)),ZEXT416((uint)fVar34),
                                auVar33);
      fVar22 = fVar22 * -fVar36;
      fVar36 = fVar36 * fVar23;
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)(fVar35 * fVar35)),ZEXT416((uint)fVar34));
      auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),auVar17,auVar17);
      auVar8 = vmulss_avx512f(auVar14,ZEXT416((uint)fVar36));
      auVar9 = vmulss_avx512f(auVar14,auVar7);
      auVar31 = vfmadd231ss_fma(auVar31,auVar18,auVar18);
      auVar10 = vfmadd231ss_avx512f(auVar8,auVar13,auVar30);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * fVar36)),auVar17,auVar30);
      auVar33 = ZEXT416((uint)fVar23);
      auVar9 = vfmadd231ss_avx512f(auVar9,auVar13,auVar33);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * auVar14._0_4_)),auVar17,auVar13);
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 * auVar7._0_4_)),auVar17,auVar33);
      auVar11 = vfmadd231ss_avx512f(auVar10,auVar32,ZEXT416((uint)fVar22));
      auVar8 = vfmadd231ss_fma(auVar8,auVar18,ZEXT416((uint)fVar22));
      auVar12 = vfnmadd231ss_avx512f(auVar9,auVar32,auVar24);
      auVar9 = vfmadd231ss_fma(auVar13,auVar18,auVar32);
      auVar10 = vfnmadd231ss_fma(auVar14,auVar18,auVar24);
      auVar13 = vmulss_avx512f(auVar12,auVar12);
      auVar13 = vfmadd231ss_avx512f(auVar13,auVar11,auVar11);
      auVar13 = vfmadd231ss_fma(auVar13,auVar9,auVar9);
      auVar13 = vsqrtss_avx(auVar13,auVar13);
      auVar14 = vdivss_avx512f(auVar11,auVar13);
      auVar11 = vdivss_avx512f(auVar12,auVar13);
      auVar9 = vdivss_avx512f(auVar9,auVar13);
      auVar11 = vsubss_avx512f(auVar11,auVar10);
      auVar13 = vinsertps_avx512f(auVar11,ZEXT416((uint)(this->minDirDifferentialX).
                                                        super_Tuple3<pbrt::Vector3,_float>.y),0x10);
      auVar9 = vsubss_avx512f(auVar9,auVar31);
      auVar12 = ZEXT416((uint)(auVar14._0_4_ - auVar8._0_4_));
      auVar14 = vinsertps_avx512f(auVar12,ZEXT416((uint)(this->minDirDifferentialX).
                                                        super_Tuple3<pbrt::Vector3,_float>.x),0x10);
      auVar13 = vmulps_avx512vl(auVar13,auVar13);
      auVar14 = vfmadd213ps_avx512vl(auVar14,auVar14,auVar13);
      auVar13 = vinsertps_avx512f(auVar9,ZEXT416((uint)(this->minDirDifferentialX).
                                                       super_Tuple3<pbrt::Vector3,_float>.z),0x10);
      auVar13 = vfmadd213ps_avx512vl(auVar13,auVar13,auVar14);
      auVar13 = vsqrtps_avx512vl(auVar13);
      vmovshdup_avx512vl(auVar13);
      vucomiss_avx512f(auVar13);
      if (auVar15._0_4_ < auVar16._0_4_) {
        auVar15 = vinsertps_avx(auVar12,auVar11,0x10);
        uVar2 = vmovlps_avx(auVar15);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = auVar9._0_4_;
      }
      auVar15 = vmovshdup_avx(auVar29);
      fVar23 = auVar15._0_4_;
      auVar15 = vfmadd213ss_fma(auVar33,auVar29,ZEXT416((uint)(auVar7._0_4_ * fVar23)));
      auVar16 = vfmadd213ss_fma(auVar30,auVar29,ZEXT416((uint)(fVar36 * fVar23)));
      auVar13 = vfnmadd231ss_fma(auVar15,auVar28,auVar24);
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar22),auVar28,auVar16);
      auVar15 = vfmadd213ss_fma(auVar17,auVar29,ZEXT416((uint)(fVar35 * fVar23)));
      auVar17 = vfmadd213ss_fma(auVar18,auVar28,auVar15);
      fVar22 = auVar13._0_4_;
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar22)),auVar16,auVar16);
      auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      fVar23 = auVar15._0_4_;
      auVar29 = ZEXT416((uint)(fVar22 / fVar23 - auVar10._0_4_));
      auVar15 = vinsertps_avx(auVar29,ZEXT416((uint)(this->minDirDifferentialY).
                                                    super_Tuple3<pbrt::Vector3,_float>.y),0x10);
      auVar13 = ZEXT416((uint)(auVar16._0_4_ / fVar23 - auVar8._0_4_));
      auVar16 = vinsertps_avx(auVar13,ZEXT416((uint)(this->minDirDifferentialY).
                                                    super_Tuple3<pbrt::Vector3,_float>.x),0x10);
      fVar23 = auVar17._0_4_ / fVar23 - auVar31._0_4_;
      auVar32._0_4_ = auVar15._0_4_ * auVar15._0_4_;
      auVar32._4_4_ = auVar15._4_4_ * auVar15._4_4_;
      auVar32._8_4_ = auVar15._8_4_ * auVar15._8_4_;
      auVar32._12_4_ = auVar15._12_4_ * auVar15._12_4_;
      auVar16 = vfmadd213ps_fma(auVar16,auVar16,auVar32);
      auVar15 = vinsertps_avx(ZEXT416((uint)fVar23),
                              ZEXT416((uint)(this->minDirDifferentialY).
                                            super_Tuple3<pbrt::Vector3,_float>.z),0x10);
      auVar15 = vfmadd213ps_fma(auVar15,auVar15,auVar16);
      auVar16 = vsqrtps_avx(auVar15);
      auVar15 = vmovshdup_avx(auVar16);
      local_110._20_4_ = auVar18._0_4_;
      local_110._88_4_ = auVar28._0_4_;
      if (auVar16._0_4_ < auVar15._0_4_) {
        auVar15 = vinsertps_avx(auVar13,auVar29,0x10);
        uVar2 = vmovlps_avx(auVar15);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar23;
      }
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x200);
  if (LOGGING_LogLevel < 1) {
    aVar1 = (anon_struct_8_0_00000001_for___align)((long)local_110 + 0x10);
    local_110._8_4_ = 0;
    local_110._12_4_ = 0;
    local_110._16_4_ = local_110._16_4_ & 0xffffff00;
    local_110._0_8_ = aVar1;
    detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((string *)local_110,"Camera min pos differentials: %s, %s",local_88,local_80);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
        ,0xde,(char *)local_110._0_8_);
    if ((anon_struct_8_0_00000001_for___align)local_110._0_8_ != aVar1) {
      operator_delete((void *)local_110._0_8_,CONCAT44(local_110._20_4_,local_110._16_4_) + 1);
    }
    if (LOGGING_LogLevel < 1) {
      local_110._8_4_ = 0;
      local_110._12_4_ = 0;
      local_110._16_4_ = local_110._16_4_ & 0xffffff00;
      local_110._0_8_ = aVar1;
      detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
                ((string *)local_110,"Camera min dir differentials: %s, %s",local_98,local_90);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
          ,0xe0,(char *)local_110._0_8_);
      if ((anon_struct_8_0_00000001_for___align)local_110._0_8_ != aVar1) {
        operator_delete((void *)local_110._0_8_,CONCAT44(local_110._20_4_,local_110._16_4_) + 1);
      }
    }
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}